

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

void __thiscall
duckdb::Serializer::
WritePropertyWithDefault<duckdb::unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>>
          (Serializer *this,field_id_t field_id,char *tag,
          unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
          *value)

{
  byte bVar1;
  
  bVar1 = (value->
          super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
          .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl !=
          (SelectStatement *)0x0 | (this->options).serialize_default_values;
  if (bVar1 == 0) {
    (*this->_vptr_Serializer[4])(this,field_id,tag,0);
  }
  else {
    (*this->_vptr_Serializer[4])(this,field_id,tag,1);
    WriteValue<duckdb::SelectStatement>
              (this,(value->
                    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
                    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl);
  }
  (*this->_vptr_Serializer[5])(this,(ulong)bVar1);
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && SerializationDefaultValue::IsDefault<T>(value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}